

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O3

int32_t ucol_getRulesEx_63(UCollator *coll,UColRuleOption delta,UChar *buffer,int32_t bufferLen)

{
  RuleBasedCollator *this;
  UErrorCode errorCode;
  UnicodeString rules;
  Char16Ptr local_78;
  UChar *local_70;
  UErrorCode local_5c;
  UnicodeString local_58;
  
  local_58.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
  local_58.fUnion.fStackFields.fLengthAndFlags = 2;
  this = (RuleBasedCollator *)
         __dynamic_cast(coll,&icu_63::Collator::typeinfo,&icu_63::RuleBasedCollator::typeinfo,0);
  if (this != (RuleBasedCollator *)0x0) {
    icu_63::RuleBasedCollator::getRules(this,delta,&local_58);
  }
  if (bufferLen < 1 || buffer == (UChar *)0x0) {
    if (-1 < local_58.fUnion.fStackFields.fLengthAndFlags) {
      local_58.fUnion.fFields.fLength = (int)local_58.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
  }
  else {
    local_5c = U_ZERO_ERROR;
    local_78.p_ = buffer;
    local_58.fUnion.fFields.fLength =
         icu_63::UnicodeString::extract(&local_58,&local_78,bufferLen,&local_5c);
    local_70 = local_78.p_;
  }
  icu_63::UnicodeString::~UnicodeString(&local_58);
  return local_58.fUnion.fFields.fLength;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getRulesEx(const UCollator *coll, UColRuleOption delta, UChar *buffer, int32_t bufferLen) {
    UnicodeString rules;
    const RuleBasedCollator *rbc = RuleBasedCollator::rbcFromUCollator(coll);
    if(rbc != NULL || coll == NULL) {
        rbc->getRules(delta, rules);
    }
    if(buffer != NULL && bufferLen > 0) {
        UErrorCode errorCode = U_ZERO_ERROR;
        return rules.extract(buffer, bufferLen, errorCode);
    } else {
        return rules.length();
    }
}